

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O2

int __thiscall hwnet::Epoll::Add(Epoll *this,Ptr *channel,int flag)

{
  int __fd;
  int iVar1;
  uint32_t local_2c;
  element_type *local_28;
  
  local_28 = (channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_2c = (flag & 0xfffffff8U) * 0x10000000 + (flag & 4U | (uint)flag >> 1 & 1) + 0x2018;
  iVar1 = this->epfd;
  __fd = (*local_28->_vptr_Channel[1])(local_28);
  iVar1 = epoll_ctl(iVar1,1,__fd,(epoll_event *)&local_2c);
  if (iVar1 == 0) {
    ((channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->events =
         local_2c;
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int Epoll::Add(const Channel::Ptr &channel,int flag) {
	epoll_event ev = {0};
	ev.data.ptr = channel.get();

	if(flag & Poller::Read) {
		ev.events |= EPOLLIN;
	}

	if(flag & Poller::Write) {
		ev.events |= EPOLLOUT;
	}

	int et = 0;
	if(flag & Poller::ET) {
		et = EPOLLET;
	}

	ev.events |= EPOLLERR | EPOLLHUP | EPOLLRDHUP | et;

	if(0 == epoll_ctl(this->epfd,EPOLL_CTL_ADD,channel->Fd(),&ev)){
		channel->events = ev.events;
		return 0;
	} else {
		return -1;
	}
}